

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O1

void __thiscall WSNTopologyBasedEnergy::TopLayer1SentSink(WSNTopologyBasedEnergy *this)

{
  WSNNode *pWVar1;
  WSNNode *pWVar2;
  Scalar *pSVar3;
  double *pdVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  WSNTopologyBasedEnergy *this_00;
  WSNTopologyBasedEnergy *pWVar17;
  WSNNode *pWVar18;
  long lVar19;
  vector<int,_std::allocator<int>_> _array;
  Mat tempimg;
  int *local_738;
  _InputArray local_710;
  _InputArray local_6f8;
  undefined8 uStack_6e0;
  WSNNode *local_6d8;
  WSNNode *local_6d0;
  Scalar *local_6c8;
  Scalar *local_6c0;
  Scalar *local_6b8;
  Scalar *local_6b0;
  WSNNode *local_6a8;
  Scalar *local_6a0;
  Scalar *local_698;
  WSNNode *local_690;
  WSNNode *local_688;
  vector<int,_std::allocator<int>_> local_680;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  WSNNode local_648;
  WSNNode local_608;
  WSNNode local_5c8;
  WSNNode local_588;
  WSNNode local_548;
  WSNNode local_508;
  WSNNode local_4c8;
  WSNNode local_488;
  WSNNode local_448;
  WSNNode local_408;
  long *local_3c8 [2];
  long local_3b8 [10];
  WSNNode local_368;
  WSNNode local_328;
  WSNNode local_2e8;
  WSNNode local_2a8;
  WSNNode local_268;
  WSNNode local_228;
  WSNNode local_1e8;
  WSNNode local_1a8;
  WSNNode local_168;
  WSNNode local_128;
  WSNNode local_e8;
  WSNNode local_a8;
  undefined1 local_70 [64];
  
  SelectServalNode(&local_680,this);
  local_738 = local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_688 = this->LayerLeaderNode;
    pWVar18 = this->LayerLeaderNode + 1;
    local_6a8 = this->LayerLeaderNode + 4;
    local_6b0 = &this->LayerLeaderNode[4].color;
    local_6d0 = this->LayerLeaderNode + 3;
    local_6c0 = &this->LayerLeaderNode[3].color;
    local_6d8 = this->LayerLeaderNode + 2;
    local_6b8 = &this->LayerLeaderNode[2].color;
    local_6c8 = &this->LayerLeaderNode[1].color;
    local_690 = &this->sink;
    local_698 = &(this->sink).color;
    local_6a0 = &this->LayerLeaderNode[0].color;
    do {
      cv::Mat::clone();
      SelectLeaderID(this);
      local_710.sz.width = 0;
      local_710.sz.height = 0;
      local_710.flags = 0x3010000;
      local_650 = 0;
      local_658._0_4_ = this->LayerLeaderNode[1].x;
      local_658._4_4_ = this->LayerLeaderNode[1].y;
      local_6f8._0_8_ = (Size *)0x4046800000000000;
      local_6f8.obj = (void *)0x4062c00000000000;
      local_6f8.sz.width = 0;
      local_6f8.sz.height = 0x40468000;
      uStack_6e0 = 0;
      local_710.obj = (Mat *)local_3c8;
      cv::line(&local_710,&local_650,&local_658,(string *)&local_6f8,1,8,0);
      lVar19 = 0x1924;
      do {
        local_710.sz.width = 0;
        local_710.sz.height = 0;
        local_710.flags = 0x3010000;
        local_660 = *(undefined8 *)((long)this + lVar19 + -0x3c);
        local_668 = *(undefined8 *)((long)this + lVar19 + -4);
        local_6f8._0_8_ = (Size *)0x0;
        local_6f8.obj = (WSNTopologyBasedEnergy *)0x406fe00000000000;
        local_6f8.sz.width = 0;
        local_6f8.sz.height = 0;
        uStack_6e0 = 0;
        local_710.obj = (Mat *)local_3c8;
        cv::line(&local_710,&local_660,&local_668,(string *)&local_6f8,1,8,0);
        local_6f8._0_8_ = &local_6f8.sz;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"WSN","");
        local_710.sz.width = 0;
        local_710.sz.height = 0;
        local_710.flags = 0x1010000;
        local_710.obj = (Mat *)local_3c8;
        cv::imshow((string *)&local_6f8,&local_710);
        if ((Size *)local_6f8._0_8_ != &local_6f8.sz) {
          operator_delete((void *)local_6f8._0_8_,(long)local_6f8.sz + 1);
        }
        pWVar1 = local_688;
        lVar19 = lVar19 + 0x38;
      } while (lVar19 != 0x1a04);
      if (this->Test != false) {
        cv::waitKey(100);
      }
      iVar16 = WSNNode::layer(this->node + *local_738);
      if (iVar16 == 0) {
        dVar5 = this->alpha;
        local_408.leaderID = pWVar1->leaderID;
        local_408.id = pWVar1->id;
        uVar8._0_4_ = pWVar1->x;
        uVar8._4_4_ = pWVar1->y;
        local_408.energy = pWVar1->energy;
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_448.leaderID = this->LayerLeaderNode[1].leaderID;
        local_448.id = this->LayerLeaderNode[1].id;
        uVar9._0_4_ = pWVar18->x;
        uVar9._4_4_ = pWVar18->y;
        local_448.energy = this->LayerLeaderNode[1].energy;
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_448._0_8_ = uVar9;
        local_408._0_8_ = uVar8;
        iVar16 = WSNNode::GetNodeID(pWVar1);
        this->node[iVar16].energy =
             this->node[iVar16].energy -
             (dVar5 * (double)(((int)uVar8 - (int)uVar9) * ((int)uVar8 - (int)uVar9) +
                              (uVar8._4_4_ - uVar9._4_4_) * (uVar8._4_4_ - uVar9._4_4_)) + 1.0);
        WSNNode::~WSNNode(&local_448);
        WSNNode::~WSNNode(&local_408);
        iVar16 = *local_738;
        local_128.leaderID = this->node[iVar16].leaderID;
        local_128.id = this->node[iVar16].id;
        pWVar2 = this->node + iVar16;
        local_128.x = pWVar2->x;
        local_128.y = pWVar2->y;
        local_128.energy = pWVar2->energy;
        pSVar3 = &this->node[iVar16].color;
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar4 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar4;
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar4[1];
        local_168.leaderID = pWVar1->leaderID;
        local_168.id = pWVar1->id;
        local_168.x = pWVar1->x;
        local_168.y = pWVar1->y;
        local_168.energy = pWVar1->energy;
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        this->node[*local_738].energy =
             this->node[*local_738].energy -
             ((double)((local_128.y - local_168.y) * (local_128.y - local_168.y) +
                      (local_128.x - local_168.x) * (local_128.x - local_168.x)) * this->alpha + 0.5
             );
        WSNNode::~WSNNode(&local_168);
        WSNNode::~WSNNode(&local_128);
        iVar16 = WSNNode::GetNodeID(pWVar18);
LAB_0010818a:
        this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
      }
      else {
        iVar16 = WSNNode::layer(this->node + *local_738);
        if (iVar16 != 1) {
          iVar16 = WSNNode::layer(this->node + *local_738);
          if (iVar16 == 2) {
            dVar5 = this->alpha;
            local_508.leaderID = local_6d8->leaderID;
            local_508.id = local_6d8->id;
            uVar10._0_4_ = local_6d8->x;
            uVar10._4_4_ = local_6d8->y;
            local_508.energy = local_6d8->energy;
            local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            local_548.leaderID = this->LayerLeaderNode[1].leaderID;
            local_548.id = this->LayerLeaderNode[1].id;
            uVar11._0_4_ = pWVar18->x;
            uVar11._4_4_ = pWVar18->y;
            local_548.energy = this->LayerLeaderNode[1].energy;
            local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                 (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                 (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            local_548._0_8_ = uVar11;
            local_508._0_8_ = uVar10;
            iVar16 = WSNNode::GetNodeID(local_6d8);
            this->node[iVar16].energy =
                 this->node[iVar16].energy -
                 (dVar5 * (double)(((int)uVar10 - (int)uVar11) * ((int)uVar10 - (int)uVar11) +
                                  (uVar10._4_4_ - uVar11._4_4_) * (uVar10._4_4_ - uVar11._4_4_)) +
                 1.0);
            WSNNode::~WSNNode(&local_548);
            WSNNode::~WSNNode(&local_508);
            iVar16 = *local_738;
            local_228.leaderID = this->node[iVar16].leaderID;
            local_228.id = this->node[iVar16].id;
            pWVar1 = this->node + iVar16;
            local_228.x = pWVar1->x;
            local_228.y = pWVar1->y;
            local_228.energy = pWVar1->energy;
            pSVar3 = &this->node[iVar16].color;
            local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            pdVar4 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
            local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar4;
            local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar4[1];
            local_268.leaderID = local_6d8->leaderID;
            local_268.id = local_6d8->id;
            local_268.x = local_6d8->x;
            local_268.y = local_6d8->y;
            local_268.energy = local_6d8->energy;
            local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                 (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            this->node[*local_738].energy =
                 this->node[*local_738].energy -
                 ((double)((local_228.y - local_268.y) * (local_228.y - local_268.y) +
                          (local_228.x - local_268.x) * (local_228.x - local_268.x)) * this->alpha +
                 0.5);
            WSNNode::~WSNNode(&local_268);
            WSNNode::~WSNNode(&local_228);
            iVar16 = WSNNode::GetNodeID(pWVar18);
          }
          else {
            iVar16 = WSNNode::layer(this->node + *local_738);
            if (iVar16 == 3) {
              dVar5 = this->alpha;
              local_588.leaderID = local_6d0->leaderID;
              local_588.id = local_6d0->id;
              uVar12._0_4_ = local_6d0->x;
              uVar12._4_4_ = local_6d0->y;
              local_588.energy = local_6d0->energy;
              local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              local_5c8.leaderID = local_6d8->leaderID;
              local_5c8.id = local_6d8->id;
              uVar13._0_4_ = local_6d8->x;
              uVar13._4_4_ = local_6d8->y;
              local_5c8.energy = local_6d8->energy;
              local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (local_6b8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              local_5c8._0_8_ = uVar13;
              local_588._0_8_ = uVar12;
              iVar16 = WSNNode::GetNodeID(local_6d0);
              this->node[iVar16].energy =
                   this->node[iVar16].energy -
                   (dVar5 * (double)(((int)uVar12 - (int)uVar13) * ((int)uVar12 - (int)uVar13) +
                                    (uVar12._4_4_ - uVar13._4_4_) * (uVar12._4_4_ - uVar13._4_4_)) +
                   1.0);
              WSNNode::~WSNNode(&local_5c8);
              WSNNode::~WSNNode(&local_588);
              iVar16 = *local_738;
              local_2a8.leaderID = this->node[iVar16].leaderID;
              local_2a8.id = this->node[iVar16].id;
              pWVar1 = this->node + iVar16;
              local_2a8.x = pWVar1->x;
              local_2a8.y = pWVar1->y;
              local_2a8.energy = pWVar1->energy;
              pSVar3 = &this->node[iVar16].color;
              local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar4 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar4;
              local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar4[1];
              local_2e8.leaderID = local_6d0->leaderID;
              local_2e8.id = local_6d0->id;
              local_2e8.x = local_6d0->x;
              local_2e8.y = local_6d0->y;
              local_2e8.energy = local_6d0->energy;
              local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              this->node[*local_738].energy =
                   this->node[*local_738].energy -
                   ((double)((local_2a8.y - local_2e8.y) * (local_2a8.y - local_2e8.y) +
                            (local_2a8.x - local_2e8.x) * (local_2a8.x - local_2e8.x)) * this->alpha
                   + 0.5);
              WSNNode::~WSNNode(&local_2e8);
              WSNNode::~WSNNode(&local_2a8);
              iVar16 = WSNNode::GetNodeID(pWVar18);
              this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
              iVar16 = WSNNode::GetNodeID(local_6d8);
            }
            else {
              dVar5 = this->alpha;
              local_608.leaderID = local_6a8->leaderID;
              local_608.id = local_6a8->id;
              uVar14._0_4_ = local_6a8->x;
              uVar14._4_4_ = local_6a8->y;
              local_608.energy = local_6a8->energy;
              local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              local_648.leaderID = local_6d0->leaderID;
              local_648.id = local_6d0->id;
              uVar15._0_4_ = local_6d0->x;
              uVar15._4_4_ = local_6d0->y;
              local_648.energy = local_6d0->energy;
              local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              local_648._0_8_ = uVar15;
              local_608._0_8_ = uVar14;
              iVar16 = WSNNode::GetNodeID(local_6a8);
              this->node[iVar16].energy =
                   this->node[iVar16].energy -
                   (dVar5 * (double)(((int)uVar14 - (int)uVar15) * ((int)uVar14 - (int)uVar15) +
                                    (uVar14._4_4_ - uVar15._4_4_) * (uVar14._4_4_ - uVar15._4_4_)) +
                   1.0);
              WSNNode::~WSNNode(&local_648);
              WSNNode::~WSNNode(&local_608);
              iVar16 = *local_738;
              local_328.leaderID = this->node[iVar16].leaderID;
              local_328.id = this->node[iVar16].id;
              pWVar1 = this->node + iVar16;
              local_328.x = pWVar1->x;
              local_328.y = pWVar1->y;
              local_328.energy = pWVar1->energy;
              pSVar3 = &this->node[iVar16].color;
              local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar4 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar4;
              local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar4[1];
              local_368.leaderID = local_6a8->leaderID;
              local_368.id = local_6a8->id;
              local_368.x = local_6a8->x;
              local_368.y = local_6a8->y;
              local_368.energy = local_6a8->energy;
              local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              this->node[*local_738].energy =
                   this->node[*local_738].energy -
                   ((double)((local_328.y - local_368.y) * (local_328.y - local_368.y) +
                            (local_328.x - local_368.x) * (local_328.x - local_368.x)) * this->alpha
                   + 0.5);
              WSNNode::~WSNNode(&local_368);
              WSNNode::~WSNNode(&local_328);
              iVar16 = WSNNode::GetNodeID(pWVar18);
              this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
              iVar16 = WSNNode::GetNodeID(local_6d8);
              this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
              iVar16 = WSNNode::GetNodeID(local_6d0);
            }
          }
          goto LAB_0010818a;
        }
        dVar5 = this->alpha;
        local_488.leaderID = this->LayerLeaderNode[1].leaderID;
        local_488.id = this->LayerLeaderNode[1].id;
        uVar6._0_4_ = pWVar18->x;
        uVar6._4_4_ = pWVar18->y;
        local_488.energy = this->LayerLeaderNode[1].energy;
        local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_4c8.leaderID = local_690->leaderID;
        local_4c8.id = local_690->id;
        uVar7._0_4_ = local_690->x;
        uVar7._4_4_ = local_690->y;
        local_4c8.energy = local_690->energy;
        local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_698->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_698->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_698->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_698->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_4c8._0_8_ = uVar7;
        local_488._0_8_ = uVar6;
        iVar16 = WSNNode::GetNodeID(pWVar18);
        this->node[iVar16].energy =
             this->node[iVar16].energy -
             (dVar5 * (double)(((int)uVar6 - (int)uVar7) * ((int)uVar6 - (int)uVar7) +
                              (uVar6._4_4_ - uVar7._4_4_) * (uVar6._4_4_ - uVar7._4_4_)) + 1.0);
        WSNNode::~WSNNode(&local_4c8);
        WSNNode::~WSNNode(&local_488);
        iVar16 = *local_738;
        local_1a8.leaderID = this->node[iVar16].leaderID;
        local_1a8.id = this->node[iVar16].id;
        pWVar1 = this->node + iVar16;
        local_1a8.x = pWVar1->x;
        local_1a8.y = pWVar1->y;
        local_1a8.energy = pWVar1->energy;
        pSVar3 = &this->node[iVar16].color;
        local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar4 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar4;
        local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar4[1];
        local_1e8.leaderID = this->LayerLeaderNode[1].leaderID;
        local_1e8.id = this->LayerLeaderNode[1].id;
        local_1e8.x = pWVar18->x;
        local_1e8.y = pWVar18->y;
        local_1e8.energy = this->LayerLeaderNode[1].energy;
        local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        this->node[*local_738].energy =
             this->node[*local_738].energy -
             ((double)((local_1a8.y - local_1e8.y) * (local_1a8.y - local_1e8.y) +
                      (local_1a8.x - local_1e8.x) * (local_1a8.x - local_1e8.x)) * this->alpha + 0.5
             );
        WSNNode::~WSNNode(&local_1e8);
        WSNNode::~WSNNode(&local_1a8);
      }
      iVar16 = *local_738;
      local_a8.leaderID = this->node[iVar16].leaderID;
      local_a8.id = this->node[iVar16].id;
      pWVar1 = this->node + iVar16;
      local_a8.x = pWVar1->x;
      local_a8.y = pWVar1->y;
      local_a8.energy = pWVar1->energy;
      pSVar3 = &this->node[iVar16].color;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar4 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar4;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar4[1];
      pWVar17 = (WSNTopologyBasedEnergy *)(local_70 + 0x20);
      this_00 = pWVar17;
      WSNNode::NodeColor((Scalar *)pWVar17,this->node + *local_738);
      drawCrossNode(this_00,&this->img,&local_a8,(Scalar *)pWVar17);
      WSNNode::~WSNNode(&local_a8);
      local_6f8._0_8_ = &local_6f8.sz;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"WSN","");
      local_710.sz.width = 0;
      local_710.sz.height = 0;
      local_710.flags = 0x1010000;
      local_710.obj = this;
      cv::imshow((string *)&local_6f8,&local_710);
      if ((Size *)local_6f8._0_8_ != &local_6f8.sz) {
        operator_delete((void *)local_6f8._0_8_,(long)local_6f8.sz + 1);
      }
      cv::Mat::~Mat((Mat *)local_3c8);
      local_738 = local_738 + 1;
    } while (local_738 !=
             local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  }
  pWVar18 = this->node;
  lVar19 = 100;
  do {
    local_e8.leaderID = pWVar18->leaderID;
    local_e8.id = pWVar18->id;
    local_e8.x = pWVar18->x;
    local_e8.y = pWVar18->y;
    local_e8.energy = pWVar18->energy;
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
         (pWVar18->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
         (pWVar18->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
         (pWVar18->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
         (pWVar18->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
    pWVar17 = (WSNTopologyBasedEnergy *)local_70;
    WSNNode::NodeColor((Scalar *)local_70,pWVar18);
    drawCrossNode(pWVar17,&this->img,&local_e8,(Scalar *)local_70);
    WSNNode::~WSNNode(&local_e8);
    local_3c8[0] = local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"WSN","");
    local_6f8.sz.width = 0;
    local_6f8.sz.height = 0;
    local_6f8.flags = 0x1010000;
    local_6f8.obj = this;
    cv::imshow((string *)local_3c8,&local_6f8);
    if (local_3c8[0] != local_3b8) {
      operator_delete(local_3c8[0],local_3b8[0] + 1);
    }
    pWVar18 = pWVar18 + 1;
    lVar19 = lVar19 + -1;
  } while (lVar19 != 0);
  if (this->Test != false) {
    cv::waitKey(400);
  }
  if (local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WSNTopologyBasedEnergy::TopLayer1SentSink()
{
	vector<int>::iterator it;
	vector<int> _array=SelectServalNode();
	for(it=_array.begin();it!=_array.end();it++)
	{
		Mat tempimg=img.clone();

		//选择每层的leader节点
		SelectLeaderID();


		// 链接所有leader节点
		line(tempimg,Point(0,0),Point(LayerLeaderNode[1].x,LayerLeaderNode[1].y),Scalar(45,150,45),1,8,0);//用黑绿色直线连接sink节点和顶层节点
		for(int i=0;i<LayerNum-1;i++)
		{
			line(tempimg,Point(LayerLeaderNode[i].x,LayerLeaderNode[i].y),Point(LayerLeaderNode[i+1].x,LayerLeaderNode[i+1].y),Scalar(0,255,0));
			imshow("WSN",tempimg);
		}
		if(true==Test) waitKey(100);


		//计算能量变化值
		if(0==node[*it].layer())
		{
			node[LayerLeaderNode[0].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[0],LayerLeaderNode[1]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[0]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
		}
		else if(1==node[*it].layer())
		{
			node[LayerLeaderNode[1].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[1],sink);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[1]);
		}
		else if(2==node[*it].layer())
		{
			node[LayerLeaderNode[2].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[2],LayerLeaderNode[1]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[2]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;

		}

		else if(3==node[*it].layer())
		{
			node[LayerLeaderNode[3].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[3],LayerLeaderNode[2]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[3]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
		}
		else 
		{
			node[LayerLeaderNode[4].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[4],LayerLeaderNode[3]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[4]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}

		//不同的能量的节点画不同的颜色
		drawCrossNode(img,node[*it],node[*it].NodeColor());
		imshow("WSN",img);	
	}
	//Leader节点的颜色变化
	for(int i=0;i<NODENUM;i++)
	{
		drawCrossNode(img,node[i],node[i].NodeColor());
		imshow("WSN",img);
	}
	if(true==Test) waitKey(400);   //两次发送的时间间隔
}